

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O3

REF_STATUS ref_dict_remove(REF_DICT ref_dict,REF_INT key)

{
  REF_INT *pRVar1;
  REF_STATUS RVar2;
  int iVar3;
  long lVar4;
  REF_INT location;
  int local_c;
  
  RVar2 = ref_dict_location(ref_dict,key,&local_c);
  if (RVar2 == 0) {
    iVar3 = ref_dict->n + -1;
    ref_dict->n = iVar3;
    if (local_c < iVar3) {
      lVar4 = (long)local_c;
      pRVar1 = ref_dict->key;
      do {
        pRVar1[lVar4] = pRVar1[lVar4 + 1];
        lVar4 = lVar4 + 1;
        iVar3 = ref_dict->n;
      } while (lVar4 < iVar3);
    }
    RVar2 = 0;
    if (local_c < iVar3) {
      pRVar1 = ref_dict->value;
      lVar4 = (long)local_c;
      do {
        pRVar1[lVar4] = pRVar1[lVar4 + 1];
        lVar4 = lVar4 + 1;
        RVar2 = 0;
      } while (lVar4 < ref_dict->n);
    }
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_dict_remove(REF_DICT ref_dict, REF_INT key) {
  REF_INT i, location;

  RAISE(ref_dict_location(ref_dict, key, &location));

  ref_dict_n(ref_dict)--;

  for (i = location; i < ref_dict_n(ref_dict); i++) {
    ref_dict->key[i] = ref_dict->key[i + 1];
  }
  for (i = location; i < ref_dict_n(ref_dict); i++) {
    ref_dict->value[i] = ref_dict->value[i + 1];
  }

  return REF_SUCCESS;
}